

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# streams.cpp
# Opt level: O2

ssize_t __thiscall AutoFile::read(AutoFile *this,int __fd,void *__buf,size_t __nbytes)

{
  long lVar1;
  int iVar2;
  void *pvVar3;
  char *pcVar4;
  undefined4 in_register_00000034;
  char *pcVar5;
  long in_FS_OFFSET;
  Span<std::byte> dst;
  
  dst.m_data = (FILE *)CONCAT44(in_register_00000034,__fd);
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  dst.m_size = (size_t)__buf;
  pvVar3 = (void *)detail_fread(this,dst);
  if (pvVar3 == __buf) {
    if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
      return *(long *)(in_FS_OFFSET + 0x28);
    }
  }
  else {
    pcVar4 = (char *)__cxa_allocate_exception(0x20);
    iVar2 = feof(this,dst.m_data);
    pcVar5 = "AutoFile::read: fread failed";
    if ((char)iVar2 != '\0') {
      pcVar5 = "AutoFile::read: end of file";
    }
    std::iostream_category();
    std::ios_base::failure[abi:cxx11]::failure(pcVar4,(error_code *)pcVar5);
    if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
      __cxa_throw(pcVar4,&std::ios_base::failure[abi:cxx11]::typeinfo,
                  std::ios_base::failure[abi:cxx11]::~failure);
    }
  }
  __stack_chk_fail();
}

Assistant:

void AutoFile::read(Span<std::byte> dst)
{
    if (detail_fread(dst) != dst.size()) {
        throw std::ios_base::failure(feof() ? "AutoFile::read: end of file" : "AutoFile::read: fread failed");
    }
}